

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void btreeblk_discard_blocks(btreeblk_handle *handle)

{
  btreeblk_handle *handle_00;
  long in_RDI;
  btreeblk_block *block;
  list_elem *e;
  btreeblk_block *block_00;
  
  handle_00 = (btreeblk_handle *)list_begin((list *)(in_RDI + 0x28));
  while (handle_00 != (btreeblk_handle *)0x0) {
    block_00 = (btreeblk_block *)&handle_00[-1].nsb;
    handle_00 = (btreeblk_handle *)list_next((list_elem *)handle_00);
    list_remove((list *)(in_RDI + 0x28),&block_00->le);
    _btreeblk_free_dirty_block(handle_00,block_00);
  }
  return;
}

Assistant:

void btreeblk_discard_blocks(struct btreeblk_handle *handle)
{
    // discard all writable blocks in the read list
    struct list_elem *e;
    struct btreeblk_block *block;

    // free items in read list
    // list
    e = list_begin(&handle->read_list);
    while(e){
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_next(&block->le);

        list_remove(&handle->read_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }
}